

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Dump.c
# Opt level: O1

void Llb_ManDumpReached(DdManager *ddG,DdNode *bReached,char *pModel,char *pFileName)

{
  uint uVar1;
  char **inames;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint *__ptr;
  void *pvVar6;
  char *pcVar7;
  char **onames;
  FILE *__stream;
  uint uVar8;
  uint uVar9;
  long lVar10;
  DdNode *bReached_local;
  
  bReached_local = bReached;
  Cudd_ReduceHeap(ddG,CUDD_REORDER_SYMM_SIFT,1);
  uVar3 = Cudd_ReadSize(ddG);
  uVar8 = uVar3;
  if (1 < uVar3) {
    uVar8 = 0;
    uVar3 = uVar3 - 1;
    if (uVar3 != 0) {
      do {
        uVar8 = uVar8 + 1;
        bVar2 = 9 < uVar3;
        uVar3 = uVar3 / 10;
      } while (bVar2);
    }
  }
  uVar4 = Cudd_ReadSize(ddG);
  __ptr = (uint *)malloc(0x10);
  uVar3 = 8;
  if (6 < uVar4 - 1) {
    uVar3 = uVar4;
  }
  __ptr[1] = 0;
  *__ptr = uVar3;
  if (uVar3 == 0) {
    pvVar6 = (void *)0x0;
  }
  else {
    pvVar6 = malloc((long)(int)uVar3 << 3);
  }
  *(void **)(__ptr + 2) = pvVar6;
  iVar5 = Cudd_ReadSize(ddG);
  if (0 < iVar5) {
    uVar3 = 0;
    do {
      sprintf(Llb_ManGetDummyName::Buffer,"%s%0*d","ff",(ulong)uVar8,(ulong)uVar3);
      pcVar7 = Extra_UtilStrsav(Llb_ManGetDummyName::Buffer);
      uVar4 = __ptr[1];
      uVar1 = *__ptr;
      if (uVar4 == uVar1) {
        if ((int)uVar1 < 0x10) {
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar6 = malloc(0x80);
          }
          else {
            pvVar6 = realloc(*(void **)(__ptr + 2),0x80);
          }
          uVar9 = 0x10;
        }
        else {
          uVar9 = uVar1 * 2;
          if ((int)uVar9 <= (int)uVar1) goto LAB_007d1ebe;
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar6 = malloc((ulong)uVar1 << 4);
          }
          else {
            pvVar6 = realloc(*(void **)(__ptr + 2),(ulong)uVar1 << 4);
          }
        }
        *(void **)(__ptr + 2) = pvVar6;
        *__ptr = uVar9;
      }
LAB_007d1ebe:
      __ptr[1] = uVar4 + 1;
      *(char **)(*(long *)(__ptr + 2) + (long)(int)uVar4 * 8) = pcVar7;
      uVar3 = uVar3 + 1;
      iVar5 = Cudd_ReadSize(ddG);
    } while ((int)uVar3 < iVar5);
  }
  onames = (char **)malloc(0x40);
  pcVar7 = Extra_UtilStrsav("Reached");
  *onames = pcVar7;
  __stream = fopen(pFileName,"wb");
  inames = *(char ***)(__ptr + 2);
  Cudd_DumpBlif(ddG,1,&bReached_local,inames,onames,pModel,(FILE *)__stream,0);
  fclose(__stream);
  uVar8 = __ptr[1];
  if (0 < (long)(int)uVar8) {
    lVar10 = 0;
    do {
      if (inames[lVar10] != (char *)0x0) {
        free(inames[lVar10]);
      }
      lVar10 = lVar10 + 1;
    } while ((int)uVar8 != lVar10);
  }
  if (*onames != (char *)0x0) {
    free(*onames);
  }
  if (inames != (char **)0x0) {
    free(inames);
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  free(onames);
  return;
}

Assistant:

void Llb_ManDumpReached( DdManager * ddG, DdNode * bReached, char * pModel, char * pFileName )
{
    FILE * pFile;
    Vec_Ptr_t * vNamesIn, * vNamesOut;
    char * pName;
    int i, nDigits;
    // reorder the BDD
    Cudd_ReduceHeap( ddG, CUDD_REORDER_SYMM_SIFT, 1 );

    // create input names
    nDigits = Abc_Base10Log( Cudd_ReadSize(ddG) );
    vNamesIn = Vec_PtrAlloc( Cudd_ReadSize(ddG) );
    for ( i = 0; i < Cudd_ReadSize(ddG); i++ )
    {
        pName = Llb_ManGetDummyName( "ff", i, nDigits );
        Vec_PtrPush( vNamesIn, Extra_UtilStrsav(pName) );
    }
    // create output names
    vNamesOut = Vec_PtrAlloc( 1 );
    Vec_PtrPush( vNamesOut, Extra_UtilStrsav("Reached") );

    // write the file
    pFile = fopen( pFileName, "wb" );
    Cudd_DumpBlif( ddG, 1, &bReached, (char **)Vec_PtrArray(vNamesIn), (char **)Vec_PtrArray(vNamesOut), pModel, pFile, 0 );
    fclose( pFile );

    // cleanup
    Vec_PtrForEachEntry( char *, vNamesIn, pName, i )
        ABC_FREE( pName );
    Vec_PtrForEachEntry( char *, vNamesOut, pName, i )
        ABC_FREE( pName );
    Vec_PtrFree( vNamesIn );
    Vec_PtrFree( vNamesOut );
}